

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

cmCPackComponentGroup * __thiscall
cmCPackIFWGenerator::GetComponentGroup
          (cmCPackIFWGenerator *this,string *projectName,string *groupName)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *msg;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_cmCPackIFWPackage_*>_>::value,_pair<iterator,_bool>_>
  _Var4;
  string local_280 [32];
  undefined1 local_260 [8];
  ostringstream cmCPackLog_msg;
  pair<cmCPackComponentGroup_*,_cmCPackIFWPackage_*> local_c8;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
  local_a8;
  cmCPackIFWPackage *local_80;
  cmCPackIFWPackage *package;
  _Self local_70 [3];
  _Self local_58;
  iterator pit;
  string name;
  cmCPackComponentGroup *group;
  string *groupName_local;
  string *projectName_local;
  cmCPackIFWGenerator *this_local;
  
  name.field_2._8_8_ =
       cmCPackGenerator::GetComponentGroup(&this->super_cmCPackGenerator,projectName,groupName);
  this_local = (cmCPackIFWGenerator *)name.field_2._8_8_;
  if ((cmCPackIFWGenerator *)name.field_2._8_8_ != (cmCPackIFWGenerator *)0x0) {
    GetGroupPackageName_abi_cxx11_((string *)&pit,this,(cmCPackComponentGroup *)name.field_2._8_8_);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
         ::find(&this->Packages,(string *)&pit);
    local_70[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
         ::end(&this->Packages);
    bVar1 = std::operator!=(&local_58,local_70);
    if (!bVar1) {
      local_80 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                 ::operator[](&this->Packages,(key_type *)&pit);
      std::__cxx11::string::operator=((string *)&local_80->Name,(string *)&pit);
      local_80->Generator = this;
      iVar2 = cmCPackIFWPackage::ConfigureFromGroup
                        (local_80,(cmCPackComponentGroup *)name.field_2._8_8_);
      if (iVar2 == 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
        ::erase(&this->Packages,(key_type *)&pit);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
        poVar3 = std::operator<<((ostream *)local_260,"Cannot configure package \"");
        poVar3 = std::operator<<(poVar3,(string *)&pit);
        poVar3 = std::operator<<(poVar3,"\" for component group \"");
        poVar3 = std::operator<<(poVar3,(string *)name.field_2._8_8_);
        poVar3 = std::operator<<(poVar3,"\"");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_00 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(this_00,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x1d4,msg);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
      }
      else {
        local_80->Installer = &this->Installer;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmCPackIFWPackage_*&,_true>
                  (&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pit,
                   &local_80);
        _Var4 = std::
                map<std::__cxx11::string,cmCPackIFWPackage*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                ::insert<std::pair<std::__cxx11::string,cmCPackIFWPackage*>>
                          ((map<std::__cxx11::string,cmCPackIFWPackage*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                            *)&(this->Installer).Packages,&local_a8);
        local_b8 = (_Base_ptr)_Var4.first._M_node;
        local_b0 = _Var4.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
        ::~pair(&local_a8);
        std::pair<cmCPackComponentGroup_*,_cmCPackIFWPackage_*>::
        pair<cmCPackComponentGroup_*&,_cmCPackIFWPackage_*&,_true>
                  (&local_c8,(cmCPackComponentGroup **)((long)&name.field_2 + 8),&local_80);
        std::
        map<cmCPackComponentGroup*,cmCPackIFWPackage*,std::less<cmCPackComponentGroup*>,std::allocator<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>>
        ::insert<std::pair<cmCPackComponentGroup*,cmCPackIFWPackage*>>
                  ((map<cmCPackComponentGroup*,cmCPackIFWPackage*,std::less<cmCPackComponentGroup*>,std::allocator<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>>
                    *)&this->GroupPackages,&local_c8);
        std::
        set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
        ::insert(&this->BinaryPackages,&local_80);
      }
    }
    this_local = (cmCPackIFWGenerator *)name.field_2._8_8_;
    package._4_4_ = 1;
    std::__cxx11::string::~string((string *)&pit);
  }
  return (cmCPackComponentGroup *)this_local;
}

Assistant:

cmCPackComponentGroup*
cmCPackIFWGenerator::GetComponentGroup(const std::string &projectName,
                                       const std::string &groupName)
{
  cmCPackComponentGroup* group
    = cmCPackGenerator::GetComponentGroup(projectName, groupName);
  if(!group) return group;

  std::string name = GetGroupPackageName(group);
  PackagesMap::iterator pit = Packages.find(name);
  if(pit != Packages.end()) return group;

  cmCPackIFWPackage *package = &Packages[name];
  package->Name = name;
  package->Generator = this;
  if(package->ConfigureFromGroup(group))
    {
    package->Installer = &Installer;
    Installer.Packages.insert(
      std::pair<std::string, cmCPackIFWPackage*>(
        name, package));
    GroupPackages.insert(
      std::pair<cmCPackComponentGroup*, cmCPackIFWPackage*>(
        group, package));
    BinaryPackages.insert(package);
    }
  else
    {
    Packages.erase(name);
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot configure package \"" << name <<
                  "\" for component group \"" << group->Name << "\""
                  << std::endl);
    }
  return group;
}